

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O0

void __thiscall
LidarSensor::PredictMeasurement
          (LidarSensor *this,MatrixXd *Xsig_pred,VectorXd *weights_m,VectorXd *weights_c,
          MatrixXd *Zsig,VectorXd *z_pred,MatrixXd *S,bool modified)

{
  double dVar1;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_00;
  Index IVar2;
  Index IVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  CoeffReturnType pdVar6;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_2a0;
  Nested local_288;
  Eigen local_280 [16];
  Type local_270;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
  local_240;
  ColXpr local_228;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_200;
  ColXpr local_1c8;
  ColXpr local_190;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_168;
  undefined1 local_110 [8];
  VectorXd z_diff;
  undefined1 local_f8 [4];
  int i_1;
  ScalarMultipleReturnType local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_a0;
  int local_5c;
  Scalar SStack_58;
  int i;
  Scalar local_50;
  int local_44;
  undefined4 local_40;
  int n_sigma;
  int n_z;
  bool modified_local;
  VectorXd *z_pred_local;
  MatrixXd *Zsig_local;
  VectorXd *weights_c_local;
  VectorXd *weights_m_local;
  MatrixXd *Xsig_pred_local;
  LidarSensor *this_local;
  
  n_sigma._3_1_ = modified;
  _n_z = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z_pred;
  z_pred_local = (VectorXd *)Zsig;
  Zsig_local = (MatrixXd *)weights_c;
  weights_c_local = weights_m;
  weights_m_local = (VectorXd *)Xsig_pred;
  Xsig_pred_local = (MatrixXd *)this;
  IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  local_40 = (undefined4)IVar2;
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z_pred_local);
  local_44 = (int)IVar3;
  local_50 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::fill(_n_z,&local_50);
  SStack_58 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)S,&stack0xffffffffffffffa8);
  for (local_5c = 0; local_5c < local_44; local_5c = local_5c + 1) {
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        weights_m_local,0,(long)local_5c);
    dVar1 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)z_pred_local
                        ,0,(long)local_5c);
    *pSVar5 = dVar1;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                        weights_m_local,1,(long)local_5c);
    dVar1 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)z_pred_local
                        ,1,(long)local_5c);
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)_n_z;
    *pSVar5 = dVar1;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        weights_c_local,(long)local_5c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((ColXpr *)local_f8,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z_pred_local,(long)local_5c);
    Eigen::operator*(&local_d0,pdVar6,(StorageBaseType *)local_f8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_a0,this_00,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_d0);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)_n_z,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)&local_a0);
  }
  for (z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
            = (uint)((n_sigma._3_1_ & 1) != 0);
      (int)z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
           _4_4_ < local_44;
      z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
           _4_4_ + 1) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_110);
    if ((n_sigma._3_1_ & 1) == 0) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_228,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z_pred_local,
                 (long)(int)z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows._4_4_);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
                (&local_200,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)
                 &local_228,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)_n_z);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)local_110,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_200);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_190,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z_pred_local,
                 (long)(int)z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows._4_4_);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_1c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)z_pred_local,0);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
                (&local_168,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)
                 &local_190,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )&local_1c8);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)local_110,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)&local_168);
    }
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Zsig_local,
                        (long)(int)z_diff.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows._4_4_);
    Eigen::operator*(local_280,pdVar6,(StorageBaseType *)local_110);
    local_288 = (Nested)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_110);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*(&local_270,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)local_280,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)&local_288
               );
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
              (&local_240,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,
               (MatrixBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
                *)&local_270);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)S,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                *)&local_240);
    Eigen::
    GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_2>
    ::~GeneralProduct(&local_270);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_110);
  }
  other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Sensor::GetR(&this->super_Sensor)
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
            (&local_2a0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)S,other);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)S,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_2a0);
  return;
}

Assistant:

void LidarSensor::PredictMeasurement(const MatrixXd &Xsig_pred, const VectorXd &weights_m, const VectorXd &weights_c,
		                     MatrixXd &Zsig, VectorXd &z_pred, MatrixXd &S, bool modified) const {

    int n_z = z_pred.rows();
    int n_sigma = Zsig.cols();

    // Initialize output
    z_pred.fill(0.0);
    S.fill(0.0);

    // transform sigma points into measurement space
    for (int i=0; i<n_sigma; i++) {  // 2n+1 sigma points
	// prepare column i
	Zsig(0,i) = Xsig_pred(0,i);
	Zsig(1,i) = Xsig_pred(1,i);

        // add to mean predicted measurement
        z_pred = z_pred + weights_m(i) * Zsig.col(i);
    }

    // measurement covariance matrix S
    for (int i=(modified)?1:0; i<n_sigma; i++) {  // 2n+1 sigma points
        // residual
	VectorXd z_diff;
	if (modified)
            z_diff = Zsig.col(i) - Zsig.col(0);
	else
	    z_diff = Zsig.col(i) - z_pred;

        S = S + weights_c(i) * z_diff * z_diff.transpose();
    }

    S = S + GetR();
}